

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenCallIndirectSetOperandAt
               (BinaryenExpressionRef expr,BinaryenIndex index,BinaryenExpressionRef operandExpr)

{
  Expression **ppEVar1;
  
  if (expr->_id != CallIndirectId) {
    __assert_fail("expression->is<CallIndirect>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x91f,
                  "void BinaryenCallIndirectSetOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
                 );
  }
  if ((ulong)index < *(ulong *)(expr + 2)) {
    if (operandExpr != (BinaryenExpressionRef)0x0) {
      ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           &expr[1].type,(ulong)index);
      *ppEVar1 = operandExpr;
      return;
    }
    __assert_fail("operandExpr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x921,
                  "void BinaryenCallIndirectSetOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
                 );
  }
  __assert_fail("index < static_cast<CallIndirect*>(expression)->operands.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x920,
                "void BinaryenCallIndirectSetOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenCallIndirectSetOperandAt(BinaryenExpressionRef expr,
                                      BinaryenIndex index,
                                      BinaryenExpressionRef operandExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<CallIndirect>());
  assert(index < static_cast<CallIndirect*>(expression)->operands.size());
  assert(operandExpr);
  static_cast<CallIndirect*>(expression)->operands[index] =
    (Expression*)operandExpr;
}